

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_remove(roaring_bitmap_t *r,uint32_t val)

{
  int iVar1;
  container_t *c;
  container_t *container2;
  container_t *pcStack_28;
  uint8_t newtypecode;
  container_t *container;
  uint16_t uStack_16;
  uint8_t typecode;
  int i;
  uint16_t hb;
  roaring_array_t *prStack_10;
  uint32_t val_local;
  roaring_bitmap_t *r_local;
  
  uStack_16 = (uint16_t)(val >> 0x10);
  i = val;
  prStack_10 = &r->high_low_container;
  container._4_4_ = ra_get_index(&r->high_low_container,uStack_16);
  if (-1 < container._4_4_) {
    ra_unshare_container_at_index(prStack_10,(uint16_t)container._4_4_);
    pcStack_28 = ra_get_container_at_index
                           (prStack_10,(uint16_t)container._4_4_,(uint8_t *)((long)&container + 3));
    container2._7_1_ = container._3_1_;
    c = container_remove(pcStack_28,(uint16_t)i,container._3_1_,(uint8_t *)((long)&container2 + 7));
    if (c != pcStack_28) {
      container_free(pcStack_28,container._3_1_);
      ra_set_container_at_index(prStack_10,container._4_4_,c,container2._7_1_);
    }
    iVar1 = container_get_cardinality(c,container2._7_1_);
    if (iVar1 == 0) {
      ra_remove_at_index_and_free(prStack_10,container._4_4_);
    }
    else {
      ra_set_container_at_index(prStack_10,container._4_4_,c,container2._7_1_);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
        if (container_get_cardinality(container2, newtypecode) != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }
    }
}